

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyObj.c
# Opt level: O0

Ivy_Obj_t * Ivy_ObjCreate(Ivy_Man_t *p,Ivy_Obj_t *pGhost)

{
  Vec_Int_t *p_00;
  int iVar1;
  uint uVar2;
  uint uVar3;
  Ivy_Type_t IVar4;
  Ivy_Obj_t *pIVar5;
  Ivy_Obj_t *pIVar6;
  Ivy_Obj_t *pObj;
  Ivy_Obj_t *pGhost_local;
  Ivy_Man_t *p_local;
  
  iVar1 = Ivy_IsComplement(pGhost);
  if (iVar1 != 0) {
    __assert_fail("!Ivy_IsComplement(pGhost)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/ivy/ivyObj.c"
                  ,0x50,"Ivy_Obj_t *Ivy_ObjCreate(Ivy_Man_t *, Ivy_Obj_t *)");
  }
  iVar1 = Ivy_ObjIsGhost(pGhost);
  if (iVar1 == 0) {
    __assert_fail("Ivy_ObjIsGhost(pGhost)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/ivy/ivyObj.c"
                  ,0x51,"Ivy_Obj_t *Ivy_ObjCreate(Ivy_Man_t *, Ivy_Obj_t *)");
  }
  pIVar5 = Ivy_TableLookup(p,pGhost);
  if (pIVar5 != (Ivy_Obj_t *)0x0) {
    __assert_fail("Ivy_TableLookup(p, pGhost) == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/ivy/ivyObj.c"
                  ,0x52,"Ivy_Obj_t *Ivy_ObjCreate(Ivy_Man_t *, Ivy_Obj_t *)");
  }
  pIVar5 = Ivy_ManFetchMemory(p);
  iVar1 = Ivy_ObjIsNone(pIVar5);
  if (iVar1 == 0) {
    __assert_fail("Ivy_ObjIsNone(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/ivy/ivyObj.c"
                  ,0x55,"Ivy_Obj_t *Ivy_ObjCreate(Ivy_Man_t *, Ivy_Obj_t *)");
  }
  iVar1 = Vec_PtrSize(p->vObjs);
  pIVar5->Id = iVar1;
  Vec_PtrPush(p->vObjs,pIVar5);
  *(uint *)&pIVar5->field_0x8 =
       *(uint *)&pIVar5->field_0x8 & 0xfffffff0 | *(uint *)&pGhost->field_0x8 & 0xf;
  *(uint *)&pIVar5->field_0x8 =
       *(uint *)&pIVar5->field_0x8 & 0xfffff9ff | (*(uint *)&pGhost->field_0x8 >> 9 & 3) << 9;
  Ivy_ObjConnect(p,pIVar5,pGhost->pFanin0,pGhost->pFanin1);
  iVar1 = Ivy_ObjIsNode(pIVar5);
  if (iVar1 == 0) {
    iVar1 = Ivy_ObjIsLatch(pIVar5);
    if (iVar1 == 0) {
      iVar1 = Ivy_ObjIsOneFanin(pIVar5);
      if (iVar1 == 0) {
        iVar1 = Ivy_ObjIsPi(pIVar5);
        if (iVar1 == 0) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/ivy/ivyObj.c"
                        ,0x65,"Ivy_Obj_t *Ivy_ObjCreate(Ivy_Man_t *, Ivy_Obj_t *)");
        }
      }
      else {
        pIVar6 = Ivy_ObjFanin0(pIVar5);
        *(uint *)&pIVar5->field_0x8 =
             *(uint *)&pIVar5->field_0x8 & 0x7ff | *(uint *)&pIVar6->field_0x8 & 0xfffff800;
      }
    }
    else {
      *(uint *)&pIVar5->field_0x8 = *(uint *)&pIVar5->field_0x8 & 0x7ff;
    }
  }
  else {
    iVar1 = Ivy_ObjLevelNew(pIVar5);
    *(uint *)&pIVar5->field_0x8 = *(uint *)&pIVar5->field_0x8 & 0x7ff | iVar1 << 0xb;
  }
  iVar1 = Ivy_ObjIsNode(pIVar5);
  if (iVar1 == 0) {
    iVar1 = Ivy_ObjIsOneFanin(pIVar5);
    if (iVar1 != 0) {
      pIVar6 = Ivy_ObjChild0(pIVar5);
      uVar2 = Ivy_ObjFaninPhase(pIVar6);
      *(uint *)&pIVar5->field_0x8 = *(uint *)&pIVar5->field_0x8 & 0xffffff7f | (uVar2 & 1) << 7;
    }
  }
  else {
    pIVar6 = Ivy_ObjChild0(pIVar5);
    uVar2 = Ivy_ObjFaninPhase(pIVar6);
    pIVar6 = Ivy_ObjChild1(pIVar5);
    uVar3 = Ivy_ObjFaninPhase(pIVar6);
    *(uint *)&pIVar5->field_0x8 =
         *(uint *)&pIVar5->field_0x8 & 0xffffff7f | (uVar2 & uVar3 & 1) << 7;
  }
  iVar1 = Ivy_ObjIsNode(pIVar5);
  if (iVar1 != 0) {
    pIVar6 = Ivy_ObjFanin0(pIVar5);
    uVar2 = *(uint *)&pIVar6->field_0x8;
    pIVar6 = Ivy_ObjFanin1(pIVar5);
    *(uint *)&pIVar5->field_0x8 =
         *(uint *)&pIVar5->field_0x8 & 0xfffffeff |
         (uVar2 >> 8 & 1 | *(uint *)&pIVar6->field_0x8 >> 8 & 1) << 8;
  }
  iVar1 = Ivy_ObjIsExor(pIVar5);
  if (iVar1 != 0) {
    pIVar6 = Ivy_ObjFanin0(pIVar5);
    *(uint *)&pIVar6->field_0x8 = *(uint *)&pIVar6->field_0x8 & 0xffffffbf | 0x40;
    pIVar6 = Ivy_ObjFanin1(pIVar5);
    *(uint *)&pIVar6->field_0x8 = *(uint *)&pIVar6->field_0x8 & 0xffffffbf | 0x40;
  }
  iVar1 = Ivy_ObjIsPi(pIVar5);
  if (iVar1 == 0) {
    iVar1 = Ivy_ObjIsPo(pIVar5);
    if (iVar1 != 0) {
      Vec_PtrPush(p->vPos,pIVar5);
    }
  }
  else {
    Vec_PtrPush(p->vPis,pIVar5);
  }
  if ((p->vRequired != (Vec_Int_t *)0x0) && (iVar1 = Vec_IntSize(p->vRequired), iVar1 <= pIVar5->Id)
     ) {
    p_00 = p->vRequired;
    iVar1 = Vec_IntSize(p->vRequired);
    Vec_IntFillExtra(p_00,iVar1 << 1,1000000);
  }
  IVar4 = Ivy_ObjType(pIVar5);
  p->nObjs[IVar4] = p->nObjs[IVar4] + 1;
  p->nCreated = p->nCreated + 1;
  if (p->pHaig != (Ivy_Man_t *)0x0) {
    Ivy_ManHaigCreateObj(p,pIVar5);
  }
  return pIVar5;
}

Assistant:

Ivy_Obj_t * Ivy_ObjCreate( Ivy_Man_t * p, Ivy_Obj_t * pGhost )
{
    Ivy_Obj_t * pObj;
    assert( !Ivy_IsComplement(pGhost) );
    assert( Ivy_ObjIsGhost(pGhost) );
    assert( Ivy_TableLookup(p, pGhost) == NULL );
    // get memory for the new object
    pObj = Ivy_ManFetchMemory( p );
    assert( Ivy_ObjIsNone(pObj) );
    pObj->Id = Vec_PtrSize(p->vObjs);
    Vec_PtrPush( p->vObjs, pObj );
    // add basic info (fanins, compls, type, init)
    pObj->Type = pGhost->Type;
    pObj->Init = pGhost->Init;
    // add connections
    Ivy_ObjConnect( p, pObj, pGhost->pFanin0, pGhost->pFanin1 );
    // compute level
    if ( Ivy_ObjIsNode(pObj) )
        pObj->Level = Ivy_ObjLevelNew(pObj);
    else if ( Ivy_ObjIsLatch(pObj) )
        pObj->Level = 0;
    else if ( Ivy_ObjIsOneFanin(pObj) )
        pObj->Level = Ivy_ObjFanin0(pObj)->Level;
    else if ( !Ivy_ObjIsPi(pObj) )
        assert( 0 );
    // create phase
    if ( Ivy_ObjIsNode(pObj) )
        pObj->fPhase = Ivy_ObjFaninPhase(Ivy_ObjChild0(pObj)) & Ivy_ObjFaninPhase(Ivy_ObjChild1(pObj));
    else if ( Ivy_ObjIsOneFanin(pObj) )
        pObj->fPhase = Ivy_ObjFaninPhase(Ivy_ObjChild0(pObj));
    // set the fail TFO flag
    if ( Ivy_ObjIsNode(pObj) )
        pObj->fFailTfo = Ivy_ObjFanin0(pObj)->fFailTfo | Ivy_ObjFanin1(pObj)->fFailTfo;
    // mark the fanins in a special way if the node is EXOR
    if ( Ivy_ObjIsExor(pObj) )
    {
        Ivy_ObjFanin0(pObj)->fExFan = 1;
        Ivy_ObjFanin1(pObj)->fExFan = 1;
    }
    // add PIs/POs to the arrays
    if ( Ivy_ObjIsPi(pObj) )
        Vec_PtrPush( p->vPis, pObj );
    else if ( Ivy_ObjIsPo(pObj) )
        Vec_PtrPush( p->vPos, pObj );
//    else if ( Ivy_ObjIsBuf(pObj) )
//        Vec_PtrPush( p->vBufs, pObj );
    if ( p->vRequired && Vec_IntSize(p->vRequired) <= pObj->Id )
        Vec_IntFillExtra( p->vRequired, 2 * Vec_IntSize(p->vRequired), 1000000 );
    // update node counters of the manager
    p->nObjs[Ivy_ObjType(pObj)]++;
    p->nCreated++;

//    printf( "Adding %sAIG node: ", p->pHaig==NULL? "H":" " );
//    Ivy_ObjPrintVerbose( p, pObj, p->pHaig==NULL );
//    printf( "\n" );

    // if HAIG is defined, create a corresponding node
    if ( p->pHaig )
        Ivy_ManHaigCreateObj( p, pObj );
    return pObj;
}